

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

int refineBySim2_left(saucy *s,coloring *c)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *randVec;
  saucy_graph *__ptr;
  void **ppvVar5;
  int *piVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  Vec_Int_t **in_stack_ffffffffffffffc0;
  
  if (0 < NUM_SIM2_ITERATION) {
    iVar4 = 0;
    do {
      randVec = assignRandomBitsToCells(s->pNtk,c);
      __ptr = buildSim2Graph(s->pNtk,c,randVec,s->iDep,(Vec_Int_t **)s->topOrder,
                             (Vec_Ptr_t **)s->obs,s->ctrl,in_stack_ffffffffffffffc0);
      if (__ptr == (saucy_graph *)0x0) {
        __assert_fail("g != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSaucy.c"
                      ,0x58a,"int refineBySim2_left(struct saucy *, struct coloring *)");
      }
      piVar7 = __ptr->adj;
      s->adj = piVar7;
      s->edg = __ptr->edg;
      iVar9 = s->nsplits;
      if (0 < s->n) {
        piVar6 = c->clen;
        iVar3 = 0;
        do {
          if (piVar6[iVar3] == 0) {
            piVar6 = s->sinduce;
            iVar8 = s->nsinduce;
            s->nsinduce = iVar8 + 1;
          }
          else {
            piVar6 = s->ninduce;
            iVar8 = s->nninduce;
            s->nninduce = iVar8 + 1;
          }
          piVar6[iVar8] = iVar3;
          s->indmark[iVar3] = '\x01';
          piVar6 = c->clen;
          iVar3 = iVar3 + piVar6[iVar3] + 1;
        } while (iVar3 < s->n);
      }
      refine(s,c);
      if (iVar9 < s->nsplits) {
        pVVar2 = s->randomVectorArray_sim2;
        uVar1 = pVVar2->nSize;
        if (uVar1 == pVVar2->nCap) {
          if ((int)uVar1 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar2->pArray,0x80);
            }
            pVVar2->pArray = ppvVar5;
            pVVar2->nCap = 0x10;
          }
          else {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
            }
            pVVar2->pArray = ppvVar5;
            pVVar2->nCap = uVar1 * 2;
          }
        }
        else {
          ppvVar5 = pVVar2->pArray;
        }
        iVar4 = pVVar2->nSize;
        pVVar2->nSize = iVar4 + 1;
        ppvVar5[iVar4] = randVec;
        if (0 < s->n) {
          piVar7 = c->clen;
          iVar4 = 0;
          do {
            if (piVar7[iVar4] == 0) {
              piVar7 = s->sinduce;
              iVar9 = s->nsinduce;
              s->nsinduce = iVar9 + 1;
            }
            else {
              piVar7 = s->ninduce;
              iVar9 = s->nninduce;
              s->nninduce = iVar9 + 1;
            }
            piVar7[iVar9] = iVar4;
            s->indmark[iVar4] = '\x01';
            piVar7 = c->clen;
            iVar4 = iVar4 + piVar7[iVar4] + 1;
          } while (iVar4 < s->n);
        }
        s->adj = s->depAdj;
        s->edg = s->depEdg;
        refine(s,c);
        piVar7 = __ptr->adj;
        iVar4 = 1;
      }
      else {
        if (randVec->pArray != (int *)0x0) {
          free(randVec->pArray);
        }
        free(randVec);
        iVar4 = iVar4 + 1;
      }
      if (piVar7 != (int *)0x0) {
        free(piVar7);
      }
      if (__ptr->edg != (int *)0x0) {
        free(__ptr->edg);
      }
      free(__ptr);
    } while (iVar4 < NUM_SIM2_ITERATION);
  }
  s->randomVectorSplit_sim2[s->lev] = s->randomVectorArray_sim2->nSize;
  return 1;
}

Assistant:

static int
refineBySim2_left(struct saucy *s, struct coloring *c) 
{
    struct saucy_graph *g;
    Vec_Int_t * randVec;    
    int i, j;
    int nsplits;    
    
    for (i = 0; i < NUM_SIM2_ITERATION; i++) {
        randVec = assignRandomBitsToCells(s->pNtk, c);      
        g = buildSim2Graph(s->pNtk, c, randVec, s->iDep, s->oDep, s->topOrder, s->obs,  s->ctrl);
        assert(g != NULL);

        s->adj = g->adj;
        s->edg = g->edg;

        nsplits = s->nsplits;
        
        for (j = 0; j < s->n; j += c->clen[j]+1)            
                add_induce(s, c, j);
        refine(s, c);

        if (s->nsplits > nsplits) {
            /* save the random vector */
            Vec_PtrPush(s->randomVectorArray_sim2, randVec);            
            i = 0; /* reset i */
            /* do more refinement by dependency graph */
            for (j = 0; j < s->n; j += c->clen[j]+1)                
                    add_induce(s, c, j);
            refineByDepGraph(s, c);
        }
        else
            Vec_IntFree(randVec);
        
        ABC_FREE( g->adj );
        ABC_FREE( g->edg );
        ABC_FREE( g );
    }

    s->randomVectorSplit_sim2[s->lev] = Vec_PtrSize(s->randomVectorArray_sim2); 

    return 1;
}